

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.cpp
# Opt level: O0

void __thiscall flatbuffers::BinaryAnnotator::FixMissingRegions(BinaryAnnotator *this)

{
  uint64_t uVar1;
  ulong offset_00;
  size_t sVar2;
  bool bVar3;
  reference ppVar4;
  reference pvVar5;
  BinaryRegion *pBVar6;
  iterator iVar7;
  iterator iVar8;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> *this_00;
  __normal_iterator<flatbuffers::BinaryRegion_*,_std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>_>
  local_368;
  const_iterator local_360;
  BinaryRegionComment local_358;
  BinaryRegion local_2e0;
  BinaryRegionComment local_240;
  BinaryRegion local_1c8;
  allocator<char> local_121;
  string local_120;
  undefined1 local_100 [8];
  BinaryRegionComment comment;
  uint64_t padding_bytes;
  uint64_t next_offset;
  BinaryRegion *region;
  size_t i;
  uint64_t offset;
  BinarySection *section;
  pair<const_unsigned_long,_flatbuffers::BinarySection> *current_section;
  iterator __end1;
  iterator __begin1;
  map<unsigned_long,_flatbuffers::BinarySection,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
  *__range1;
  vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> regions_to_insert;
  BinaryAnnotator *this_local;
  
  regions_to_insert.
  super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::vector
            ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> *)
             &__range1);
  __end1 = std::
           map<unsigned_long,_flatbuffers::BinarySection,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
           ::begin(&this->sections_);
  current_section =
       (pair<const_unsigned_long,_flatbuffers::BinarySection> *)
       std::
       map<unsigned_long,_flatbuffers::BinarySection,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>_>
       ::end(&this->sections_);
  while (bVar3 = std::operator!=(&__end1,(_Self *)&current_section), bVar3) {
    ppVar4 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>::
             operator*(&__end1);
    bVar3 = std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
            empty(&(ppVar4->second).regions);
    if (!bVar3) {
      pvVar5 = std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
               operator[](&(ppVar4->second).regions,0);
      uVar1 = pvVar5->offset;
      pvVar5 = std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
               operator[](&(ppVar4->second).regions,0);
      i = uVar1 + pvVar5->length;
      for (region = (BinaryRegion *)0x1;
          pBVar6 = (BinaryRegion *)
                   std::
                   vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                   size(&(ppVar4->second).regions), region < pBVar6;
          region = (BinaryRegion *)((long)&region->offset + 1)) {
        pvVar5 = std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                 ::operator[](&(ppVar4->second).regions,(size_type_conflict)region);
        offset_00 = pvVar5->offset;
        bVar3 = IsValidOffset(this,offset_00);
        if (bVar3) {
          if (i < offset_00) {
            comment.index = offset_00 - i;
            BinaryRegionComment::BinaryRegionComment((BinaryRegionComment *)local_100);
            comment.status_message.field_2._8_4_ = 4;
            bVar3 = anon_unknown_46::IsNonZeroRegion(i,comment.index,this->binary_);
            sVar2 = comment.index;
            if (bVar3) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"",&local_121)
              ;
              anon_unknown_46::SetError
                        ((BinaryRegionComment *)local_100,WARN_NO_REFERENCES,&local_120);
              std::__cxx11::string::~string((string *)&local_120);
              std::allocator<char>::~allocator(&local_121);
              sVar2 = comment.index;
              BinaryRegionComment::BinaryRegionComment(&local_240,(BinaryRegionComment *)local_100);
              anon_unknown_46::MakeBinaryRegion(&local_1c8,i,sVar2,Unknown,sVar2,0,&local_240);
              std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
              push_back((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                         *)&__range1,&local_1c8);
              BinaryRegion::~BinaryRegion(&local_1c8);
              BinaryRegionComment::~BinaryRegionComment(&local_240);
            }
            else {
              BinaryRegionComment::BinaryRegionComment(&local_358,(BinaryRegionComment *)local_100);
              anon_unknown_46::MakeBinaryRegion(&local_2e0,i,sVar2,Uint8,sVar2,0,&local_358);
              std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
              push_back((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                         *)&__range1,&local_2e0);
              BinaryRegion::~BinaryRegion(&local_2e0);
              BinaryRegionComment::~BinaryRegionComment(&local_358);
            }
            BinaryRegionComment::~BinaryRegionComment((BinaryRegionComment *)local_100);
          }
          i = offset_00 + pvVar5->length;
        }
      }
      bVar3 = std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
              empty((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> *
                    )&__range1);
      if (!bVar3) {
        this_00 = &(ppVar4->second).regions;
        local_368._M_current =
             (BinaryRegion *)
             std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::end
                       (this_00);
        __gnu_cxx::
        __normal_iterator<flatbuffers::BinaryRegion_const*,std::vector<flatbuffers::BinaryRegion,std::allocator<flatbuffers::BinaryRegion>>>
        ::__normal_iterator<flatbuffers::BinaryRegion*>
                  ((__normal_iterator<flatbuffers::BinaryRegion_const*,std::vector<flatbuffers::BinaryRegion,std::allocator<flatbuffers::BinaryRegion>>>
                    *)&local_360,&local_368);
        iVar7 = std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                begin((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                       *)&__range1);
        iVar8 = std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                end((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> *
                    )&__range1);
        std::vector<flatbuffers::BinaryRegion,std::allocator<flatbuffers::BinaryRegion>>::
        insert<__gnu_cxx::__normal_iterator<flatbuffers::BinaryRegion*,std::vector<flatbuffers::BinaryRegion,std::allocator<flatbuffers::BinaryRegion>>>,void>
                  ((vector<flatbuffers::BinaryRegion,std::allocator<flatbuffers::BinaryRegion>> *)
                   this_00,local_360,
                   (__normal_iterator<flatbuffers::BinaryRegion_*,_std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>_>
                    )iVar7._M_current,
                   (__normal_iterator<flatbuffers::BinaryRegion_*,_std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>_>
                    )iVar8._M_current);
        iVar7 = std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                begin(&(ppVar4->second).regions);
        iVar8 = std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::
                end(&(ppVar4->second).regions);
        std::
        stable_sort<__gnu_cxx::__normal_iterator<flatbuffers::BinaryRegion*,std::vector<flatbuffers::BinaryRegion,std::allocator<flatbuffers::BinaryRegion>>>,bool(*)(flatbuffers::BinaryRegion_const&,flatbuffers::BinaryRegion_const&)>
                  ((__normal_iterator<flatbuffers::BinaryRegion_*,_std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>_>
                    )iVar7._M_current,
                   (__normal_iterator<flatbuffers::BinaryRegion_*,_std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>_>
                    )iVar8._M_current,anon_unknown_46::BinaryRegionSort);
        std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::clear
                  ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> *)
                   &__range1);
      }
    }
    std::_Rb_tree_iterator<std::pair<const_unsigned_long,_flatbuffers::BinarySection>_>::operator++
              (&__end1);
  }
  std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
            ((vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_> *)
             &__range1);
  return;
}

Assistant:

void BinaryAnnotator::FixMissingRegions() {
  std::vector<BinaryRegion> regions_to_insert;
  for (auto &current_section : sections_) {
    BinarySection &section = current_section.second;
    if (section.regions.empty()) {
      // TODO(dbaileychess): is this possible?
      continue;
    }

    uint64_t offset = section.regions[0].offset + section.regions[0].length;
    for (size_t i = 1; i < section.regions.size(); ++i) {
      BinaryRegion &region = section.regions[i];

      const uint64_t next_offset = region.offset;
      if (!IsValidOffset(next_offset)) {
        // TODO(dbaileychess): figure out how we get into this situation.
        continue;
      }

      if (offset < next_offset) {
        const uint64_t padding_bytes = next_offset - offset;

        BinaryRegionComment comment;
        comment.type = BinaryRegionCommentType::Padding;

        if (IsNonZeroRegion(offset, padding_bytes, binary_)) {
          SetError(comment, BinaryRegionStatus::WARN_NO_REFERENCES);
          regions_to_insert.push_back(
              MakeBinaryRegion(offset, padding_bytes, BinaryRegionType::Unknown,
                               padding_bytes, 0, comment));
        } else {
          regions_to_insert.push_back(
              MakeBinaryRegion(offset, padding_bytes, BinaryRegionType::Uint8,
                               padding_bytes, 0, comment));
        }
      }
      offset = next_offset + region.length;
    }

    if (!regions_to_insert.empty()) {
      section.regions.insert(section.regions.end(), regions_to_insert.begin(),
                             regions_to_insert.end());
      std::stable_sort(section.regions.begin(), section.regions.end(),
                       BinaryRegionSort);
      regions_to_insert.clear();
    }
  }
}